

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

size_t readback_part(curl_mimepart *part,char *buffer,size_t bufsize)

{
  mime_state *state;
  void **ppvVar1;
  char *__dest;
  size_t *psVar2;
  byte bVar3;
  byte bVar4;
  char *pcVar5;
  size_t numbytes;
  size_t sVar6;
  curl_slist *pcVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  _Bool _Var11;
  ulong __n;
  size_t sStack_80;
  char *local_60;
  char *local_50;
  
  state = &part->state;
  ppvVar1 = &(part->state).ptr;
  __dest = (part->encstate).buf;
  sVar9 = 0;
  local_60 = buffer;
  for (; bufsize != 0; bufsize = bufsize - sStack_80) {
    sStack_80 = 0;
    if (MIMESTATE_END < state->state) goto switchD_0046021f_caseD_5;
    pcVar7 = (curl_slist *)*ppvVar1;
    switch(state->state) {
    case MIMESTATE_BEGIN:
      pcVar7 = part->curlheaders;
      (part->state).state = ((part->flags & 2) >> 1) * 3 + MIMESTATE_CURLHEADERS;
      (part->state).ptr = pcVar7;
      goto LAB_004604d5;
    case MIMESTATE_CURLHEADERS:
      if (pcVar7 == (curl_slist *)0x0) {
        pcVar7 = part->userheaders;
LAB_0046049a:
        (part->state).state = MIMESTATE_USERHEADERS;
      }
      else {
LAB_004602d4:
        pcVar5 = pcVar7->data;
        numbytes = strlen(pcVar5);
        sStack_80 = readback_bytes(state,local_60,bufsize,pcVar5,numbytes,"\r\n");
        if (sStack_80 != 0) break;
        pcVar7 = pcVar7->next;
      }
      (part->state).ptr = pcVar7;
LAB_004604d5:
      (part->state).offset = 0;
LAB_004604dd:
      sStack_80 = 0;
      break;
    case MIMESTATE_USERHEADERS:
      if (pcVar7 != (curl_slist *)0x0) {
        pcVar5 = match_header(pcVar7,"Content-Type",0xc);
        if (pcVar5 != (char *)0x0) {
          pcVar7 = pcVar7->next;
          goto LAB_0046049a;
        }
        goto LAB_004602d4;
      }
      state->state = MIMESTATE_EOH;
      goto LAB_0046048f;
    case MIMESTATE_EOH:
      sStack_80 = readback_bytes(state,local_60,bufsize,"\r\n",2,"");
      if (sStack_80 == 0) {
        state->state = MIMESTATE_BODY;
        goto LAB_0046048f;
      }
      break;
    case MIMESTATE_BODY:
      (part->encstate).bufend = 0;
      (part->encstate).pos = 0;
      (part->encstate).bufbeg = 0;
      state->state = MIMESTATE_CONTENT;
LAB_0046048f:
      *ppvVar1 = (void *)0x0;
      (part->state).offset = 0;
      goto LAB_004604dd;
    case MIMESTATE_CONTENT:
      if (part->encoder != (mime_encoder *)0x0) {
        sStack_80 = 0;
        local_50 = local_60;
        bVar3 = 0;
        sVar8 = bufsize;
LAB_00460335:
        bVar4 = bVar3;
        if (sVar8 != 0) {
LAB_00460346:
          do {
            bVar3 = bVar4;
            uVar10 = (part->encstate).bufbeg;
            __n = (part->encstate).bufend;
            if ((bool)(uVar10 < __n | bVar3)) {
              _Var11 = (_Bool)(uVar10 >= __n | bVar3);
              sVar6 = (*part->encoder->encodefunc)(local_50,sVar8,_Var11,part);
              if (sVar6 != 0) goto LAB_00460441;
              if (_Var11 != false) break;
              uVar10 = (part->encstate).bufbeg;
              __n = (part->encstate).bufend;
            }
            if (uVar10 != 0) {
              __n = __n - uVar10;
              if (__n != 0) {
                memmove(__dest,__dest + uVar10,__n);
              }
              (part->encstate).bufbeg = 0;
              (part->encstate).bufend = __n;
            }
            if (0xff < __n) {
              if (sStack_80 != 0) break;
              sStack_80 = 0xffffffffffffffff;
              goto LAB_00460566;
            }
            bVar4 = 1;
            if (part->readfunc != (curl_read_callback)0x0) {
              sVar6 = (*part->readfunc)(__dest + __n,1,0x100 - __n,part->arg);
              if (1 < sVar6 - 0x10000000) {
                if (sVar6 == 0) goto LAB_00460346;
                if (sVar6 != 0xffffffffffffffff) {
                  psVar2 = &(part->encstate).bufend;
                  *psVar2 = *psVar2 + sVar6;
                  bVar4 = bVar3;
                  goto LAB_00460346;
                }
              }
              if (sStack_80 == 0) {
                sStack_80 = sVar6;
              }
              break;
            }
          } while( true );
        }
        goto LAB_0046051f;
      }
      if (part->readfunc == (curl_read_callback)0x0) {
LAB_00460537:
        (part->state).state = MIMESTATE_END;
        *ppvVar1 = (void *)0x0;
        (part->state).offset = 0;
        if ((part->kind == MIMEKIND_FILE) && ((FILE *)part->fp != (FILE *)0x0)) {
          fclose((FILE *)part->fp);
          part->fp = (FILE *)0x0;
        }
        sStack_80 = 0;
      }
      else {
        sStack_80 = (*part->readfunc)(local_60,1,bufsize,part->arg);
LAB_0046051f:
        if ((1 < sStack_80 - 0x10000000) && (sStack_80 != 0xffffffffffffffff)) {
          if (sStack_80 != 0) break;
          goto LAB_00460537;
        }
      }
LAB_00460566:
      if (sVar9 == 0) {
        sVar9 = sStack_80;
      }
    case MIMESTATE_END:
      goto switchD_0046021f_caseD_8;
    }
switchD_0046021f_caseD_5:
    sVar9 = sVar9 + sStack_80;
    local_60 = local_60 + sStack_80;
  }
switchD_0046021f_caseD_8:
  return sVar9;
LAB_00460441:
  if ((sVar6 - 0x10000000 < 2) || (sVar6 == 0xffffffffffffffff)) {
    if (sStack_80 == 0) {
      sStack_80 = sVar6;
    }
    goto LAB_0046051f;
  }
  sStack_80 = sStack_80 + sVar6;
  local_50 = local_50 + sVar6;
  sVar8 = sVar8 - sVar6;
  goto LAB_00460335;
}

Assistant:

static size_t readback_part(curl_mimepart *part,
                            char *buffer, size_t bufsize)
{
  size_t cursize = 0;
#ifdef CURL_DOES_CONVERSIONS
  char *convbuf = buffer;
#endif

  /* Readback from part. */

  while(bufsize) {
    size_t sz = 0;
    struct curl_slist *hdr = (struct curl_slist *) part->state.ptr;
    switch(part->state.state) {
    case MIMESTATE_BEGIN:
      mimesetstate(&part->state,
                   (part->flags & MIME_BODY_ONLY)?
                     MIMESTATE_BODY: MIMESTATE_CURLHEADERS,
                   part->curlheaders);
      break;
    case MIMESTATE_USERHEADERS:
      if(!hdr) {
        mimesetstate(&part->state, MIMESTATE_EOH, NULL);
        break;
      }
      if(match_header(hdr, "Content-Type", 12)) {
        mimesetstate(&part->state, MIMESTATE_USERHEADERS, hdr->next);
        break;
      }
      /* FALLTHROUGH */
    case MIMESTATE_CURLHEADERS:
      if(!hdr)
        mimesetstate(&part->state, MIMESTATE_USERHEADERS, part->userheaders);
      else {
        sz = readback_bytes(&part->state, buffer, bufsize,
                            hdr->data, strlen(hdr->data), "\r\n");
        if(!sz)
          mimesetstate(&part->state, part->state.state, hdr->next);
      }
      break;
    case MIMESTATE_EOH:
      sz = readback_bytes(&part->state, buffer, bufsize, "\r\n", 2, "");
      if(!sz)
        mimesetstate(&part->state, MIMESTATE_BODY, NULL);
      break;
    case MIMESTATE_BODY:
#ifdef CURL_DOES_CONVERSIONS
      if(part->easy && convbuf < buffer) {
        CURLcode result = Curl_convert_to_network(part->easy, convbuf,
                                                  buffer - convbuf);
        if(result)
          return READ_ERROR;
        convbuf = buffer;
      }
#endif
      cleanup_encoder_state(&part->encstate);
      mimesetstate(&part->state, MIMESTATE_CONTENT, NULL);
      break;
    case MIMESTATE_CONTENT:
      if(part->encoder)
        sz = read_encoded_part_content(part, buffer, bufsize);
      else
        sz = read_part_content(part, buffer, bufsize);
      switch(sz) {
      case 0:
        mimesetstate(&part->state, MIMESTATE_END, NULL);
        /* Try sparing open file descriptors. */
        if(part->kind == MIMEKIND_FILE && part->fp) {
          fclose(part->fp);
          part->fp = NULL;
        }
        /* FALLTHROUGH */
      case CURL_READFUNC_ABORT:
      case CURL_READFUNC_PAUSE:
      case READ_ERROR:
        return cursize? cursize: sz;
      }
      break;
    case MIMESTATE_END:
      return cursize;
    default:
      break;    /* Other values not in part state. */
    }

    /* Bump buffer and counters according to read size. */
    cursize += sz;
    buffer += sz;
    bufsize -= sz;
  }

#ifdef CURL_DOES_CONVERSIONS
      if(part->easy && convbuf < buffer &&
         part->state.state < MIMESTATE_BODY) {
        CURLcode result = Curl_convert_to_network(part->easy, convbuf,
                                                  buffer - convbuf);
        if(result)
          return READ_ERROR;
      }
#endif

  return cursize;
}